

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

bool __thiscall AST::equals(AST *this,AST *t)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  string local_58;
  string local_38;
  
  if (t != (AST *)0x0) {
    getText_abi_cxx11_(&local_38,this);
    getText_abi_cxx11_(&local_58,t);
    if ((local_38._M_string_length == local_58._M_string_length) &&
       ((local_38._M_string_length == 0 ||
        (iVar1 = bcmp(local_38._M_dataplus._M_p,local_58._M_dataplus._M_p,local_38._M_string_length)
        , iVar1 == 0)))) {
      iVar1 = (*this->node->_vptr_ASTNode[3])();
      iVar2 = (*t->node->_vptr_ASTNode[3])();
      bVar3 = iVar1 == iVar2;
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool AST::equals(const AST* t) const
{
	if (!t)
		return false;
	return (getText() == t->getText()) && (getType() == t->getType());
}